

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O3

uoffset_t __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateUninitializedVector
          (FlatBufferBuilderImpl<false> *this,size_t len,size_t elemsize,size_t alignment,
          uint8_t **buf)

{
  uint8_t **ppuVar1;
  uint uVar2;
  uint uVar3;
  size_t len_00;
  
  NotNested(this);
  StartVector<flatbuffers::Offset,unsigned_int>(this,len,elemsize,alignment);
  len_00 = elemsize * len;
  if (len_00 == 0) {
    uVar3 = (this->buf_).size_;
  }
  else {
    vector_downward<unsigned_int>::ensure_space(&this->buf_,len_00);
    ppuVar1 = &(this->buf_).cur_;
    *ppuVar1 = *ppuVar1 + -len_00;
    uVar3 = (int)len_00 + (this->buf_).size_;
    (this->buf_).size_ = uVar3;
  }
  uVar2 = EndVector<unsigned_int,unsigned_int>(this,len);
  *buf = (this->buf_).buf_ + ((this->buf_).reserved_ - (ulong)uVar3);
  return uVar2;
}

Assistant:

uoffset_t CreateUninitializedVector(size_t len, size_t elemsize,
                                      size_t alignment, uint8_t **buf) {
    NotNested();
    StartVector(len, elemsize, alignment);
    buf_.make_space(len * elemsize);
    const uoffset_t vec_start = GetSizeRelative32BitRegion();
    auto vec_end = EndVector(len);
    *buf = buf_.data_at(vec_start);
    return vec_end;
  }